

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_logic.cc
# Opt level: O0

bool __thiscall
CLogicSocket::_HandlePing
          (CLogicSocket *this,lp_connection_t pConn,LPSTRUC_MSG_HEADER pMsgHeader,char *pPkgBody,
          unsigned_short iBodyLength)

{
  SourceFile file;
  SourceFile file_00;
  LogLevel LVar1;
  time_t tVar2;
  long in_RSI;
  undefined8 in_RDI;
  short in_R8W;
  MutexLockGuard lock;
  undefined4 in_stack_ffffffffffffdfb8;
  int in_stack_ffffffffffffdfbc;
  Logger *in_stack_ffffffffffffdfc0;
  undefined4 in_stack_ffffffffffffdfc8;
  undefined4 in_stack_ffffffffffffdfcc;
  undefined4 uVar3;
  SourceFile *in_stack_ffffffffffffdfd0;
  unsigned_short iMsgCode;
  LPSTRUC_MSG_HEADER in_stack_ffffffffffffdfe8;
  CLogicSocket *in_stack_ffffffffffffdff0;
  Logger local_2008;
  SourceFile local_1008 [253];
  short local_2a;
  long local_18;
  byte local_1;
  
  iMsgCode = (unsigned_short)((ulong)in_RDI >> 0x30);
  local_2a = in_R8W;
  local_18 = in_RSI;
  LVar1 = muduo::Logger::logLevel();
  if ((int)LVar1 < 3) {
    muduo::Logger::SourceFile::SourceFile<101>
              (in_stack_ffffffffffffdfd0,
               (char (*) [101])CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8));
    in_stack_ffffffffffffdfd0 = local_1008;
    file.data_._4_4_ = in_stack_ffffffffffffdfcc;
    file.data_._0_4_ = in_stack_ffffffffffffdfc8;
    file._8_8_ = in_stack_ffffffffffffdfd0;
    muduo::Logger::Logger(in_stack_ffffffffffffdfc0,file,in_stack_ffffffffffffdfbc);
    muduo::Logger::stream((Logger *)in_stack_ffffffffffffdfd0);
    muduo::LogStream::operator<<
              ((LogStream *)in_stack_ffffffffffffdfd0,
               (char *)CONCAT44(in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8));
    muduo::Logger::~Logger((Logger *)in_stack_ffffffffffffdff0);
  }
  if (local_2a == 0) {
    muduo::MutexLockGuard::MutexLockGuard
              ((MutexLockGuard *)in_stack_ffffffffffffdfc0,
               (MutexLock *)CONCAT44(in_stack_ffffffffffffdfbc,in_stack_ffffffffffffdfb8));
    uVar3 = 0;
    tVar2 = time((time_t *)0x0);
    *(time_t *)(local_18 + 0x108) = tVar2;
    SendNoBodyPkgToClient(in_stack_ffffffffffffdff0,in_stack_ffffffffffffdfe8,iMsgCode);
    LVar1 = muduo::Logger::logLevel();
    if ((int)LVar1 < 3) {
      muduo::Logger::SourceFile::SourceFile<101>
                (in_stack_ffffffffffffdfd0,(char (*) [101])CONCAT44(uVar3,LVar1));
      file_00.data_._4_4_ = uVar3;
      file_00.data_._0_4_ = LVar1;
      file_00._8_8_ = in_stack_ffffffffffffdfd0;
      muduo::Logger::Logger(in_stack_ffffffffffffdfc0,file_00,in_stack_ffffffffffffdfbc);
      muduo::Logger::stream(&local_2008);
      muduo::LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffffdfd0,(char *)CONCAT44(uVar3,LVar1));
      muduo::Logger::~Logger((Logger *)in_stack_ffffffffffffdff0);
    }
    local_1 = 1;
    muduo::MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x142d8e);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool CLogicSocket::_HandlePing(lp_connection_t pConn,LPSTRUC_MSG_HEADER pMsgHeader,char *pPkgBody,unsigned short iBodyLength)
{
    LOG_INFO << "执行了CLogicSocket::_HandlePing()!" ;
    //（1）首先判断心跳包的合法性
    if(iBodyLength != 0)   //有包体则认为是  非法包
    {
        
        return false;
    }

    muduo::MutexLockGuard lock(pConn->logicPorcMutex);
    pConn->lastPingTime = time(NULL);  //更新心跳包的时间

    //服务器给客户端返回一个只有包头的数据包
    SendNoBodyPkgToClient(pMsgHeader, _CMD_PING);



    LOG_INFO << "成功发送心跳包并返回";

    return true;
}